

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::predict_or_learn_bag<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  pointer *ppfVar1;
  polyprediction *this;
  uint uVar2;
  pointer ppeVar3;
  pointer ppeVar4;
  pointer pfVar5;
  iterator __position;
  action_score *paVar6;
  bool bVar7;
  bool bVar8;
  action_score *paVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint32_t uVar16;
  float fVar17;
  v_array<ACTION_SCORE::action_score> *__range3;
  action_score local_78;
  action_score *local_70;
  polyprediction *local_68;
  example *local_60;
  example *local_58;
  ulong local_50;
  vector<float,_std::allocator<float>_> *local_48;
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar4 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_60 = *ppeVar3;
  this = &local_60->pred;
  bVar8 = CB::ec_is_example_header(local_60);
  uVar14 = (int)((ulong)((long)ppeVar4 - (long)ppeVar3) >> 3) - (uint)bVar8;
  if (uVar14 == 0) {
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)&this->scalars);
    return;
  }
  pfVar5 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar5) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar5;
  }
  iVar15 = uVar14 + (uVar14 == 0);
  local_68 = this;
  do {
    local_78 = (action_score)((ulong)local_78 & 0xffffffff00000000);
    __position._M_current =
         (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&data->scores,__position,(float *)&local_78);
    }
    else {
      *__position._M_current = 0.0;
      ppfVar1 = &(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  local_48 = &data->top_actions;
  local_50 = (ulong)uVar14;
  local_78 = (action_score)((ulong)local_78 & 0xffffffff00000000);
  std::vector<float,_std::allocator<float>_>::_M_fill_assign
            (local_48,local_50,(value_type_conflict4 *)&local_78);
  local_58 = test_adf_sequence(examples);
  if (data->bag_size != 0) {
    uVar11 = 0;
    do {
      bVar8 = false;
      uVar14 = 1;
      uVar16 = (uint32_t)uVar11;
      if ((uVar16 == 0) && (data->greedify != false)) {
        bVar7 = true;
      }
      else {
        fVar17 = merand48(&data->all->random_state);
        if (fVar17 <= 0.36787945) {
          bVar7 = true;
          bVar8 = true;
          uVar14 = 0;
        }
        else if (fVar17 <= 0.7357589) {
          bVar7 = true;
          bVar8 = false;
        }
        else {
          if (fVar17 <= 0.9196986) {
            uVar14 = 2;
          }
          else if (fVar17 <= 0.98101187) {
            uVar14 = 3;
          }
          else if (fVar17 <= 0.99634016) {
            uVar14 = 4;
          }
          else if (fVar17 <= 0.9994058) {
            uVar14 = 5;
          }
          else if (fVar17 <= 0.99991673) {
            uVar14 = 6;
          }
          else if (fVar17 <= 0.99998975) {
            uVar14 = 7;
          }
          else if (fVar17 <= 0.99999887) {
            uVar14 = 8;
          }
          else if (fVar17 <= 0.9999999) {
            uVar14 = 9;
          }
          else if (fVar17 <= 1.0) {
            uVar14 = 10;
          }
          else if (fVar17 <= 1.0) {
            uVar14 = 0xb;
          }
          else if (fVar17 <= 1.0) {
            uVar14 = 0xc;
          }
          else if (fVar17 <= 1.0) {
            uVar14 = 0xd;
          }
          else if (fVar17 <= 1.0) {
            uVar14 = 0xe;
          }
          else if (fVar17 <= 1.0) {
            uVar14 = 0xf;
          }
          else if (fVar17 <= 1.0) {
            uVar14 = 0x10;
          }
          else if (fVar17 <= 1.0) {
            uVar14 = 0x11;
          }
          else if (fVar17 <= 1.0) {
            uVar14 = 0x12;
          }
          else {
            uVar14 = 0x14;
          }
          bVar8 = false;
          bVar7 = false;
        }
      }
      if (local_58 == (example *)0x0 || bVar8) {
        LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,uVar16);
      }
      else {
        LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,uVar16);
      }
      paVar6 = (action_score *)(local_60->pred).scalars._end;
      for (paVar9 = (local_60->pred).a_s._begin; paVar9 != paVar6; paVar9 = paVar9 + 1) {
        pfVar5 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar5[paVar9->action] = paVar9->score + pfVar5[paVar9->action];
      }
      if (data->first_only == false) {
        paVar9 = (local_60->pred).a_s._begin;
        lVar12 = (long)(local_60->pred).scalars._end - (long)paVar9;
        if (lVar12 == 0) {
          uVar11 = 0;
        }
        else {
          uVar13 = lVar12 >> 3;
          uVar10 = 1;
          uVar11 = uVar10;
          if (1 < uVar13) {
            do {
              uVar11 = uVar10;
              if ((paVar9[uVar10].score != paVar9->score) ||
                 (NAN(paVar9[uVar10].score) || NAN(paVar9->score))) break;
              uVar10 = uVar10 + 1;
              uVar11 = uVar13;
            } while (uVar13 != uVar10);
          }
        }
        if (uVar11 != 0) {
          uVar10 = 0;
          do {
            pfVar5 = (local_48->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pfVar5[(uint)(local_68->scalars)._begin[uVar10 * 2]] =
                 pfVar5[(uint)(local_68->scalars)._begin[uVar10 * 2]] + 1.0 / (float)uVar11;
            uVar10 = uVar10 + 1;
          } while (uVar11 != uVar10);
        }
      }
      else {
        uVar2 = ((local_68->a_s)._begin)->action;
        pfVar5 = (local_48->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar5[uVar2] = pfVar5[uVar2] + 1.0;
      }
      if (!bVar7 && local_58 != (example *)0x0) {
        if (uVar14 < 3) {
          uVar14 = 2;
        }
        iVar15 = uVar14 - 1;
        do {
          LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,uVar16);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      uVar11 = (ulong)(uVar16 + 1);
    } while (uVar11 < data->bag_size);
  }
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.action = 0;
    local_78.score = 0.0;
    do {
      uVar16 = local_78.action;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,&local_78);
      local_78.action = uVar16 + 1;
      local_78.score = 0.0;
    } while ((ulong)local_78 <
             (ulong)((long)(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  local_70 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_78 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::
  generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
            ((data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_78,&local_40);
  local_70 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_78 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (data->epsilon,1,&local_78,&local_40);
  do_sort(data);
  lVar12 = 0;
  do {
    *(undefined8 *)((long)(local_68->scalars)._begin + lVar12) =
         *(undefined8 *)((long)&((data->action_probs)._begin)->action + lVar12);
    lVar12 = lVar12 + 8;
  } while ((local_50 + (local_50 == 0)) * 8 != lVar12);
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)examples.size();
  if (CB::ec_is_example_header(*examples[0]))
    num_actions--;
  if (num_actions == 0)
  {
    preds.clear();
    return;
  }

  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(0.f);
  vector<float>& top_actions = data.top_actions;
  top_actions.assign(num_actions, 0);
  bool test_sequence = test_adf_sequence(examples) == nullptr;
  for (uint32_t i = 0; i < data.bag_size; i++)
  {
    // avoid updates to the random num generator
    // for greedify, always update first policy once
    uint32_t count = is_learn ? ((data.greedify && i == 0) ? 1 : BS::weight_gen(*data.all)) : 0;

    if (is_learn && count > 0 && !test_sequence)
      multiline_learn_or_predict<true>(base, examples, data.offset, i);
    else
      multiline_learn_or_predict<false>(base, examples, data.offset, i);

    assert(preds.size() == num_actions);
    for (auto e : preds) data.scores[e.action] += e.score;

    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      for (size_t i = 0; i < tied_actions; ++i) top_actions[preds[i].action] += 1.f / tied_actions;
    }
    else
      top_actions[preds[0].action] += 1.f;
    if (is_learn && !test_sequence)
      for (uint32_t j = 1; j < count; j++) multiline_learn_or_predict<true>(base, examples, data.offset, i);
  }

  data.action_probs.clear();
  for (uint32_t i = 0; i < data.scores.size(); i++) data.action_probs.push_back({i, 0.});

  // generate distribution over actions
  generate_bag(
      begin(data.top_actions), end(data.top_actions), begin_scores(data.action_probs), end_scores(data.action_probs));

  enforce_minimum_probability(data.epsilon, true, begin_scores(data.action_probs), end_scores(data.action_probs));

  do_sort(data);

  for (size_t i = 0; i < num_actions; i++) preds[i] = data.action_probs[i];
}